

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void wallify_map(level *lev,int x1,int y1,int x2,int y2)

{
  schar sVar1;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int hi_yy;
  int hi_xx;
  int lo_yy;
  int lo_xx;
  int yy;
  int xx;
  int y;
  int x;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  level *lev_local;
  
  yy = y1;
  do {
    if (y2 < yy) {
      return;
    }
    if (yy < 1) {
      local_44 = 0;
    }
    else {
      local_44 = yy + -1;
    }
    xx = x1;
    local_48 = y2;
    if (yy < y2) {
      local_48 = yy + 1;
    }
    for (; xx <= x2; xx = xx + 1) {
      if (lev->locations[xx][yy].typ == '\0') {
        if (xx < 1) {
          local_4c = 0;
        }
        else {
          local_4c = xx + -1;
        }
        local_50 = x2;
        if (xx < x2) {
          local_50 = xx + 1;
        }
        for (lo_yy = local_44; lo_yy <= local_48; lo_yy = lo_yy + 1) {
          for (lo_xx = local_4c; lo_xx <= local_50; lo_xx = lo_xx + 1) {
            if (('\x18' < lev->locations[lo_xx][lo_yy].typ) ||
               (lev->locations[lo_xx][lo_yy].typ == '\a')) {
              sVar1 = '\x01';
              if (lo_yy != yy) {
                sVar1 = '\x02';
              }
              lev->locations[xx][yy].typ = sVar1;
              lo_yy = local_48;
              break;
            }
          }
        }
      }
    }
    yy = yy + 1;
  } while( true );
}

Assistant:

static void wallify_map(struct level *lev, int x1, int y1, int x2, int y2)
{
	int x, y, xx, yy, lo_xx, lo_yy, hi_xx, hi_yy;

	for (y = y1; y <= y2; y++) {
	    lo_yy = (y > 0) ? y - 1 : 0;
	    hi_yy = (y < y2) ? y + 1 : y2;
	    for (x = x1; x <= x2; x++) {
		if (lev->locations[x][y].typ != STONE) continue;
		lo_xx = (x > 0) ? x - 1 : 0;
		hi_xx = (x < x2) ? x + 1 : x2;
		for (yy = lo_yy; yy <= hi_yy; yy++) {
		    for (xx = lo_xx; xx <= hi_xx; xx++) {
			if (IS_ROOM(lev->locations[xx][yy].typ) ||
			    lev->locations[xx][yy].typ == CROSSWALL) {
			    lev->locations[x][y].typ = (yy != y) ? HWALL : VWALL;
			    yy = hi_yy;		/* end 'yy' loop */
			    break;		/* end 'xx' loop */
			}
		    }
		}
	    }
	}
}